

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_parser.h
# Opt level: O0

Status sentencepiece::SentencePieceTrainer::SetProtoField
                 (string_view name,string_view value,TrainerSpec *message)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_10;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_17;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_18;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_19;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_20;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_21;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_22;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_23;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_24;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_25;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_26;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_27;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_28;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_29;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_30;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_31;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_32;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_33;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_34;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_35;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_36;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_37;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_38;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_39;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_40;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_41;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_42;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  basic_string_view<char,_std::char_traits<char>_> __x_19;
  basic_string_view<char,_std::char_traits<char>_> __x_20;
  basic_string_view<char,_std::char_traits<char>_> __x_21;
  basic_string_view<char,_std::char_traits<char>_> __x_22;
  basic_string_view<char,_std::char_traits<char>_> __x_23;
  basic_string_view<char,_std::char_traits<char>_> __x_24;
  basic_string_view<char,_std::char_traits<char>_> __x_25;
  basic_string_view<char,_std::char_traits<char>_> __x_26;
  basic_string_view<char,_std::char_traits<char>_> __x_27;
  basic_string_view<char,_std::char_traits<char>_> __x_28;
  basic_string_view<char,_std::char_traits<char>_> __x_29;
  basic_string_view<char,_std::char_traits<char>_> __x_30;
  basic_string_view<char,_std::char_traits<char>_> __x_31;
  basic_string_view<char,_std::char_traits<char>_> __x_32;
  basic_string_view<char,_std::char_traits<char>_> __x_33;
  basic_string_view<char,_std::char_traits<char>_> __x_34;
  basic_string_view<char,_std::char_traits<char>_> __x_35;
  basic_string_view<char,_std::char_traits<char>_> __x_36;
  basic_string_view<char,_std::char_traits<char>_> __x_37;
  basic_string_view<char,_std::char_traits<char>_> __x_38;
  basic_string_view<char,_std::char_traits<char>_> __x_39;
  basic_string_view<char,_std::char_traits<char>_> __x_40;
  basic_string_view<char,_std::char_traits<char>_> __x_41;
  basic_string_view<char,_std::char_traits<char>_> __x_42;
  string_view value_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>
  __l;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view arg_04;
  string_view arg_05;
  string_view arg_06;
  string_view arg_07;
  string_view arg_08;
  string_view arg_09;
  string_view arg_10;
  string_view arg_11;
  string_view arg_12;
  string_view arg_13;
  string_view arg_14;
  string_view arg_15;
  string_view arg_16;
  string_view arg_17;
  string_view arg_18;
  string_view arg_19;
  string_view arg_20;
  string_view arg_21;
  string_view arg_22;
  string_view arg_23;
  string_view arg_24;
  string_view arg_25;
  string_view arg_26;
  string_view arg_27;
  bool bVar1;
  int iVar2;
  StatusBuilder *pSVar3;
  size_t in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  in_RDI;
  char *in_R8;
  long in_R9;
  uint64 v_28;
  double v_27;
  bool v_26;
  int32 v_25;
  int32 v_24;
  int32 v_23;
  int32 v_22;
  bool v_21;
  bool v_20;
  bool v_19;
  bool v_18;
  bool v_17;
  string *val_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  string *val_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  bool v_16;
  bool v_15;
  bool v_14;
  bool v_13;
  bool v_12;
  bool v_11;
  int32 v_10;
  int32 v_9;
  int32 v_8;
  int32 v_7;
  double v_6;
  int32 v_5;
  bool v_4;
  uint64 v_3;
  double v_2;
  int32 v_1;
  string *val_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  int32 v;
  const_iterator it;
  string *val;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int in_stack_ffffffffffffbe98;
  float in_stack_ffffffffffffbe9c;
  StatusBuilder *in_stack_ffffffffffffbea0;
  string *in_stack_ffffffffffffbea8;
  StatusBuilder *in_stack_ffffffffffffbeb0;
  size_t in_stack_ffffffffffffbeb8;
  TrainerSpec_ModelType *in_stack_ffffffffffffbec0;
  char (*in_stack_ffffffffffffbec8) [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
  *in_stack_ffffffffffffbed0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffbed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffbee0;
  StatusBuilder *in_stack_ffffffffffffbee8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
  *in_stack_ffffffffffffbef0;
  iterator in_stack_ffffffffffffbef8;
  size_type in_stack_ffffffffffffbf00;
  size_t in_stack_ffffffffffffbf60;
  char *in_stack_ffffffffffffbf68;
  bool *in_stack_ffffffffffffbf78;
  size_t in_stack_ffffffffffffbf80;
  char *in_stack_ffffffffffffbf88;
  double *in_stack_ffffffffffffc050;
  size_t in_stack_ffffffffffffc058;
  char *in_stack_ffffffffffffc060;
  undefined1 **local_3ca8;
  StatusBuilder local_3c30 [2];
  size_t local_3930;
  char *local_3928;
  undefined8 local_3908;
  undefined8 local_3900;
  size_t local_3778;
  char *local_3770;
  undefined8 local_3750;
  undefined8 local_3748;
  size_t local_35c0;
  char *local_35b8;
  undefined8 local_3598;
  undefined8 local_3590;
  allocator<char> local_3581;
  string local_3580 [48];
  undefined8 local_3550;
  undefined8 local_3548;
  allocator<char> local_3539;
  string local_3538 [48];
  undefined8 local_3508;
  undefined8 local_3500;
  allocator<char> local_34f1;
  string local_34f0 [48];
  undefined8 local_34c0;
  undefined8 local_34b8;
  allocator<char> local_34a9;
  string local_34a8 [48];
  undefined8 local_3478;
  undefined8 local_3470;
  allocator<char> local_3461;
  string local_3460 [48];
  undefined8 local_3430;
  undefined8 local_3428;
  size_t local_32a0;
  char *local_3298;
  undefined8 local_3278;
  undefined8 local_3270;
  size_t local_30e8;
  char *local_30e0;
  undefined8 local_30c0;
  undefined8 local_30b8;
  size_t local_2f30;
  char *local_2f28;
  undefined8 local_2f08;
  undefined8 local_2f00;
  size_t local_2d78;
  char *local_2d70;
  undefined8 local_2d50;
  undefined8 local_2d48;
  size_t local_2bc0;
  char *local_2bb8;
  undefined8 local_2b98;
  undefined8 local_2b90;
  allocator<char> local_2b81;
  string local_2b80 [48];
  undefined8 local_2b50;
  undefined8 local_2b48;
  size_t local_29c0;
  char *local_29b8;
  undefined8 local_2998;
  undefined8 local_2990;
  size_t local_2808;
  char *local_2800;
  undefined8 local_27e0;
  undefined8 local_27d8;
  size_t local_2650;
  char *local_2648;
  undefined8 local_2628;
  undefined8 local_2620;
  size_t local_2498;
  char *local_2490;
  undefined8 local_2470;
  undefined8 local_2468;
  allocator<char> local_2459;
  string local_2458 [48];
  undefined8 local_2428;
  undefined8 local_2420;
  reference local_2418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2410;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2408;
  size_t local_2400;
  char *local_23f8;
  undefined1 local_23f0 [24];
  undefined1 *local_23d8;
  undefined8 local_23c0;
  undefined8 local_23b8;
  reference local_23b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_23a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_23a0;
  size_t local_2398;
  char *local_2390;
  undefined1 local_2388 [24];
  undefined1 *local_2370;
  undefined8 local_2358;
  undefined8 local_2350;
  size_t local_21c8;
  char *local_21c0;
  undefined8 local_21a0;
  undefined8 local_2198;
  size_t local_2010;
  char *local_2008;
  undefined8 local_1fe8;
  undefined8 local_1fe0;
  allocator<char> local_1fd1;
  string local_1fd0 [48];
  undefined8 local_1fa0;
  undefined8 local_1f98;
  size_t local_1e10;
  char *local_1e08;
  undefined8 local_1de8;
  undefined8 local_1de0;
  size_t local_1c58;
  char *local_1c50;
  undefined8 local_1c30;
  undefined8 local_1c28;
  size_t local_1aa0;
  char *local_1a98;
  undefined8 local_1a78;
  undefined8 local_1a70;
  size_t local_18e8;
  char *local_18e0;
  undefined8 local_18c0;
  undefined8 local_18b8;
  size_t local_1730;
  char *local_1728;
  undefined8 local_1708;
  undefined8 local_1700;
  size_t local_1578;
  char *local_1570;
  undefined8 local_1550;
  undefined8 local_1548;
  size_t local_13c0;
  char *local_13b8;
  undefined8 local_1398;
  undefined8 local_1390;
  size_t local_1208;
  char *local_1200;
  undefined8 local_11e0;
  undefined8 local_11d8;
  size_t local_1050;
  char *local_1048;
  undefined8 local_1028;
  undefined8 local_1020;
  size_t local_e98;
  char *local_e90;
  undefined8 local_e70;
  undefined8 local_e68;
  size_t local_ce0;
  char *local_cd8;
  undefined8 local_cb8;
  undefined8 local_cb0;
  size_t local_b28;
  char *local_b20;
  undefined8 local_b00;
  undefined8 local_af8;
  size_t local_970;
  char *local_968;
  undefined8 local_948;
  undefined8 local_940;
  size_t local_7b8;
  char *local_7b0;
  undefined8 local_790;
  undefined8 local_788;
  reference local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_778;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_770;
  size_t local_768;
  char *local_760;
  undefined1 local_758 [24];
  undefined1 *local_740;
  undefined8 local_728;
  undefined8 local_720;
  size_t local_598;
  char *local_590;
  undefined8 local_570;
  undefined8 local_568;
  _Self local_3e0;
  size_t local_3d8;
  char *pcStack_3d0;
  string local_3c0 [32];
  _Self local_3a0 [3];
  undefined8 local_388;
  undefined8 local_380;
  undefined8 *local_370;
  undefined1 *local_368 [5];
  undefined1 local_340 [40];
  undefined1 local_318 [40];
  undefined1 local_2f0 [40];
  undefined8 *local_2c8;
  undefined8 local_2c0;
  allocator<char> local_2b1;
  string local_2b0 [48];
  undefined8 local_280;
  undefined8 local_278;
  allocator<char> local_269;
  string local_268 [48];
  undefined8 local_238;
  undefined8 local_230;
  reference local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  size_t local_210;
  char *local_208;
  undefined1 local_200 [24];
  undefined1 *local_1e8;
  undefined4 local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  if (in_R9 == 0) {
    util::StatusBuilder::StatusBuilder
              (in_stack_ffffffffffffbea0,(StatusCode)in_stack_ffffffffffffbe9c);
    util::StatusBuilder::operator<<
              (in_stack_ffffffffffffbea0,
               (char (*) [44])CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
    util::StatusBuilder::operator<<
              (in_stack_ffffffffffffbea0,
               (char (*) [2])CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
    local_1c0 = 0xc5;
    util::StatusBuilder::operator<<
              (in_stack_ffffffffffffbea0,
               (int *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
    util::StatusBuilder::operator<<
              (in_stack_ffffffffffffbea0,
               (char (*) [4])CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
    util::StatusBuilder::operator<<
              (in_stack_ffffffffffffbea0,
               (char (*) [8])CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
    util::StatusBuilder::operator<<
              (in_stack_ffffffffffffbea0,
               (char (*) [3])CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
    util::StatusBuilder::operator_cast_to_Status(in_stack_ffffffffffffbee8);
    util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4ca128);
  }
  else {
    local_28._M_len = in_RCX;
    local_28._M_str = in_R8;
    local_18 = in_RSI;
    local_10 = in_RDX;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffbeb0,
               (char *)in_stack_ffffffffffffbea8);
    __x._M_str = (char *)in_stack_ffffffffffffbed0;
    __x._M_len = (size_t)in_stack_ffffffffffffbec8;
    __y._M_str = (char *)in_stack_ffffffffffffbec0;
    __y._M_len = in_stack_ffffffffffffbeb8;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      local_210 = local_28._M_len;
      local_208 = local_28._M_str;
      text._M_str = in_stack_ffffffffffffbf68;
      text._M_len = in_stack_ffffffffffffbf60;
      util::StrSplitAsCSV_abi_cxx11_(text);
      local_1e8 = local_200;
      local_218._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
      local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_ffffffffffffbea0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
        if (!bVar1) break;
        local_228 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_218);
        TrainerSpec::add_input
                  ((TrainerSpec *)in_stack_ffffffffffffbea0,
                   (string *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_218);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffbeb0);
      util::OkStatus();
    }
    else {
      local_238 = local_18;
      local_230 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffbeb0,
                 (char *)in_stack_ffffffffffffbea8);
      __x_00._M_str = (char *)in_stack_ffffffffffffbed0;
      __x_00._M_len = (size_t)in_stack_ffffffffffffbec8;
      __y_00._M_str = (char *)in_stack_ffffffffffffbec0;
      __y_00._M_len = in_stack_ffffffffffffbeb8;
      bVar1 = std::operator==(__x_00,__y_00);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (in_stack_ffffffffffffbee0,in_stack_ffffffffffffbed8,
                   (allocator<char> *)in_stack_ffffffffffffbed0);
        TrainerSpec::set_input_format
                  ((TrainerSpec *)in_stack_ffffffffffffbeb0,in_stack_ffffffffffffbea8);
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::~allocator(&local_269);
        util::OkStatus();
      }
      else {
        local_280 = local_18;
        local_278 = local_10;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffbeb0,
                   (char *)in_stack_ffffffffffffbea8);
        __x_01._M_str = (char *)in_stack_ffffffffffffbed0;
        __x_01._M_len = (size_t)in_stack_ffffffffffffbec8;
        __y_01._M_str = (char *)in_stack_ffffffffffffbec0;
        __y_01._M_len = in_stack_ffffffffffffbeb8;
        bVar1 = std::operator==(__x_01,__y_01);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (in_stack_ffffffffffffbee0,in_stack_ffffffffffffbed8,
                     (allocator<char> *)in_stack_ffffffffffffbed0);
          TrainerSpec::set_model_prefix
                    ((TrainerSpec *)in_stack_ffffffffffffbeb0,in_stack_ffffffffffffbea8);
          std::__cxx11::string::~string(local_2b0);
          std::allocator<char>::~allocator(&local_2b1);
          util::OkStatus();
        }
        else {
          if (SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
              ::kModelType_Map_abi_cxx11_ == '\0') {
            iVar2 = __cxa_guard_acquire(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                                         ::kModelType_Map_abi_cxx11_);
            if (iVar2 != 0) {
              local_370 = local_368;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
              ::pair<const_char_(&)[8],_true>
                        (in_stack_ffffffffffffbed0,in_stack_ffffffffffffbec8,
                         in_stack_ffffffffffffbec0);
              local_370 = (undefined8 *)local_340;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
              ::pair<const_char_(&)[4],_true>
                        (in_stack_ffffffffffffbed0,(char (*) [4])in_stack_ffffffffffffbec8,
                         in_stack_ffffffffffffbec0);
              local_370 = (undefined8 *)local_318;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
              ::pair<const_char_(&)[5],_true>
                        (in_stack_ffffffffffffbed0,(char (*) [5])in_stack_ffffffffffffbec8,
                         in_stack_ffffffffffffbec0);
              local_370 = (undefined8 *)local_2f0;
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
              ::pair<const_char_(&)[5],_true>
                        (in_stack_ffffffffffffbed0,(char (*) [5])in_stack_ffffffffffffbec8,
                         in_stack_ffffffffffffbec0);
              local_2c8 = local_368;
              local_2c0 = 4;
              std::
              allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>
              ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>
                           *)0x4ca614);
              __l._M_len = in_stack_ffffffffffffbf00;
              __l._M_array = in_stack_ffffffffffffbef8;
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
              ::map(in_stack_ffffffffffffbef0,__l,
                    (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffbee8,(allocator_type *)in_stack_ffffffffffffbee0);
              std::
              allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>
              ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>
                            *)0x4ca64f);
              local_3ca8 = (undefined1 **)&local_2c8;
              do {
                local_3ca8 = local_3ca8 + -5;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
                ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>
                         *)0x4ca686);
              } while (local_3ca8 != local_368);
              __cxa_atexit(std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
                           ::~map,&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                                   ::kModelType_Map_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&SetProtoField(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,sentencepiece::TrainerSpec*)
                                   ::kModelType_Map_abi_cxx11_);
            }
          }
          local_388 = local_18;
          local_380 = local_10;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffbeb0,
                     (char *)in_stack_ffffffffffffbea8);
          __x_02._M_str = (char *)in_stack_ffffffffffffbed0;
          __x_02._M_len = (size_t)in_stack_ffffffffffffbec8;
          __y_02._M_str = (char *)in_stack_ffffffffffffbec0;
          __y_02._M_len = in_stack_ffffffffffffbeb8;
          bVar1 = std::operator==(__x_02,__y_02);
          if (bVar1) {
            local_3d8 = local_28._M_len;
            pcStack_3d0 = local_28._M_str;
            value_00._M_str = (char *)in_stack_ffffffffffffbef8;
            value_00._M_len = (size_t)in_stack_ffffffffffffbef0;
            absl::AsciiStrToUpper_abi_cxx11_(value_00);
            local_3a0[0]._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
                         *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98),
                        (key_type *)0x4ca774);
            std::__cxx11::string::~string(local_3c0);
            local_3e0._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>_>
                        *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
            bVar1 = std::operator==(local_3a0,&local_3e0);
            if (bVar1) {
              util::StatusBuilder::StatusBuilder
                        (in_stack_ffffffffffffbea0,(StatusCode)in_stack_ffffffffffffbe9c,
                         in_stack_ffffffffffffbe98);
              util::StatusBuilder::operator<<
                        (in_stack_ffffffffffffbea0,
                         (char (*) [31])
                         CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
              util::StatusBuilder::operator<<
                        (in_stack_ffffffffffffbeb0,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffbea8);
              util::StatusBuilder::operator<<
                        (in_stack_ffffffffffffbea0,
                         (char (*) [6])CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98)
                        );
              util::StatusBuilder::operator<<
                        (in_stack_ffffffffffffbea0,
                         (char (*) [15])
                         CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
              util::StatusBuilder::operator_cast_to_Status(in_stack_ffffffffffffbee8);
              util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4ca886);
            }
            else {
              std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>
              ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::TrainerSpec_ModelType>_>
                            *)0x4ca9e5);
              TrainerSpec::set_model_type
                        ((TrainerSpec *)in_stack_ffffffffffffbea0,
                         (TrainerSpec_ModelType)in_stack_ffffffffffffbe9c);
              util::OkStatus();
            }
          }
          else {
            local_570 = local_18;
            local_568 = local_10;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffbeb0
                       ,(char *)in_stack_ffffffffffffbea8);
            __x_03._M_str = (char *)in_stack_ffffffffffffbed0;
            __x_03._M_len = (size_t)in_stack_ffffffffffffbec8;
            __y_03._M_str = (char *)in_stack_ffffffffffffbec0;
            __y_03._M_len = in_stack_ffffffffffffbeb8;
            bVar1 = std::operator==(__x_03,__y_03);
            if (bVar1) {
              local_598 = local_28._M_len;
              local_590 = local_28._M_str;
              arg_12._M_str = in_stack_ffffffffffffc060;
              arg_12._M_len = in_stack_ffffffffffffc058;
              bVar1 = string_util::lexical_cast<int>(arg_12,(int *)in_stack_ffffffffffffc050);
              if (bVar1) {
                TrainerSpec::set_vocab_size
                          ((TrainerSpec *)in_stack_ffffffffffffbea0,(int32)in_stack_ffffffffffffbe9c
                          );
                util::OkStatus();
              }
              else {
                util::StatusBuilder::StatusBuilder
                          (in_stack_ffffffffffffbea0,(StatusCode)in_stack_ffffffffffffbe9c,
                           in_stack_ffffffffffffbe98);
                util::StatusBuilder::operator<<
                          (in_stack_ffffffffffffbea0,
                           (char (*) [15])
                           CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                util::StatusBuilder::operator<<
                          (in_stack_ffffffffffffbeb0,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_ffffffffffffbea8);
                util::StatusBuilder::operator<<
                          (in_stack_ffffffffffffbea0,
                           (char (*) [10])
                           CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                util::StatusBuilder::operator_cast_to_Status(in_stack_ffffffffffffbee8);
                util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cab49);
              }
            }
            else {
              local_728 = local_18;
              local_720 = local_10;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffbeb0,(char *)in_stack_ffffffffffffbea8);
              __x_04._M_str = (char *)in_stack_ffffffffffffbed0;
              __x_04._M_len = (size_t)in_stack_ffffffffffffbec8;
              __y_04._M_str = (char *)in_stack_ffffffffffffbec0;
              __y_04._M_len = in_stack_ffffffffffffbeb8;
              bVar1 = std::operator==(__x_04,__y_04);
              if (bVar1) {
                local_768 = local_28._M_len;
                local_760 = local_28._M_str;
                text_00._M_str = in_stack_ffffffffffffbf68;
                text_00._M_len = in_stack_ffffffffffffbf60;
                util::StrSplitAsCSV_abi_cxx11_(text_00);
                local_740 = local_758;
                local_770._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                local_778 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                while( true ) {
                  bVar1 = __gnu_cxx::operator!=
                                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)in_stack_ffffffffffffbea0,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98
                                                ));
                  if (!bVar1) break;
                  local_780 = __gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&local_770);
                  TrainerSpec::add_accept_language
                            ((TrainerSpec *)in_stack_ffffffffffffbea0,
                             (string *)CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98)
                            );
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_770);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffbeb0);
                util::OkStatus();
              }
              else {
                local_790 = local_18;
                local_788 = local_10;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_ffffffffffffbeb0,(char *)in_stack_ffffffffffffbea8);
                __x_05._M_str = (char *)in_stack_ffffffffffffbed0;
                __x_05._M_len = (size_t)in_stack_ffffffffffffbec8;
                __y_05._M_str = (char *)in_stack_ffffffffffffbec0;
                __y_05._M_len = in_stack_ffffffffffffbeb8;
                bVar1 = std::operator==(__x_05,__y_05);
                if (bVar1) {
                  local_7b8 = local_28._M_len;
                  local_7b0 = local_28._M_str;
                  arg_13._M_str = in_stack_ffffffffffffc060;
                  arg_13._M_len = in_stack_ffffffffffffc058;
                  bVar1 = string_util::lexical_cast<int>(arg_13,(int *)in_stack_ffffffffffffc050);
                  if (bVar1) {
                    TrainerSpec::set_self_test_sample_size
                              ((TrainerSpec *)in_stack_ffffffffffffbea0,
                               (int32)in_stack_ffffffffffffbe9c);
                    util::OkStatus();
                  }
                  else {
                    util::StatusBuilder::StatusBuilder
                              (in_stack_ffffffffffffbea0,(StatusCode)in_stack_ffffffffffffbe9c,
                               in_stack_ffffffffffffbe98);
                    util::StatusBuilder::operator<<
                              (in_stack_ffffffffffffbea0,
                               (char (*) [15])
                               CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                    util::StatusBuilder::operator<<
                              (in_stack_ffffffffffffbeb0,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_ffffffffffffbea8);
                    util::StatusBuilder::operator<<
                              (in_stack_ffffffffffffbea0,
                               (char (*) [10])
                               CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                    util::StatusBuilder::operator_cast_to_Status(in_stack_ffffffffffffbee8);
                    util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cae52);
                  }
                }
                else {
                  local_948 = local_18;
                  local_940 = local_10;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_ffffffffffffbeb0,(char *)in_stack_ffffffffffffbea8);
                  __x_06._M_str = (char *)in_stack_ffffffffffffbed0;
                  __x_06._M_len = (size_t)in_stack_ffffffffffffbec8;
                  __y_06._M_str = (char *)in_stack_ffffffffffffbec0;
                  __y_06._M_len = in_stack_ffffffffffffbeb8;
                  bVar1 = std::operator==(__x_06,__y_06);
                  if (bVar1) {
                    local_970 = local_28._M_len;
                    local_968 = local_28._M_str;
                    arg_14._M_str = in_stack_ffffffffffffc060;
                    arg_14._M_len = in_stack_ffffffffffffc058;
                    bVar1 = string_util::lexical_cast<double>(arg_14,in_stack_ffffffffffffc050);
                    if (bVar1) {
                      TrainerSpec::set_character_coverage
                                ((TrainerSpec *)in_stack_ffffffffffffbea0,in_stack_ffffffffffffbe9c)
                      ;
                      util::OkStatus();
                    }
                    else {
                      util::StatusBuilder::StatusBuilder
                                (in_stack_ffffffffffffbea0,(StatusCode)in_stack_ffffffffffffbe9c,
                                 in_stack_ffffffffffffbe98);
                      util::StatusBuilder::operator<<
                                (in_stack_ffffffffffffbea0,
                                 (char (*) [15])
                                 CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                      util::StatusBuilder::operator<<
                                (in_stack_ffffffffffffbeb0,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_ffffffffffffbea8);
                      util::StatusBuilder::operator<<
                                (in_stack_ffffffffffffbea0,
                                 (char (*) [10])
                                 CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                      util::StatusBuilder::operator_cast_to_Status(in_stack_ffffffffffffbee8);
                      util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cafe5);
                    }
                  }
                  else {
                    local_b00 = local_18;
                    local_af8 = local_10;
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_ffffffffffffbeb0,(char *)in_stack_ffffffffffffbea8);
                    __x_07._M_str = (char *)in_stack_ffffffffffffbed0;
                    __x_07._M_len = (size_t)in_stack_ffffffffffffbec8;
                    __y_07._M_str = (char *)in_stack_ffffffffffffbec0;
                    __y_07._M_len = in_stack_ffffffffffffbeb8;
                    bVar1 = std::operator==(__x_07,__y_07);
                    if (bVar1) {
                      local_b28 = local_28._M_len;
                      local_b20 = local_28._M_str;
                      arg_15._M_str = in_stack_ffffffffffffc060;
                      arg_15._M_len = in_stack_ffffffffffffc058;
                      bVar1 = string_util::lexical_cast<unsigned_long>
                                        (arg_15,(unsigned_long *)in_stack_ffffffffffffc050);
                      if (bVar1) {
                        TrainerSpec::set_input_sentence_size
                                  ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                   CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                        util::OkStatus();
                      }
                      else {
                        util::StatusBuilder::StatusBuilder
                                  (in_stack_ffffffffffffbea0,(StatusCode)in_stack_ffffffffffffbe9c,
                                   in_stack_ffffffffffffbe98);
                        util::StatusBuilder::operator<<
                                  (in_stack_ffffffffffffbea0,
                                   (char (*) [15])
                                   CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                        util::StatusBuilder::operator<<
                                  (in_stack_ffffffffffffbeb0,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_ffffffffffffbea8);
                        util::StatusBuilder::operator<<
                                  (in_stack_ffffffffffffbea0,
                                   (char (*) [10])
                                   CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                        util::StatusBuilder::operator_cast_to_Status(in_stack_ffffffffffffbee8);
                        util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cb17e);
                      }
                    }
                    else {
                      local_cb8 = local_18;
                      local_cb0 = local_10;
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_ffffffffffffbeb0,(char *)in_stack_ffffffffffffbea8);
                      __x_08._M_str = (char *)in_stack_ffffffffffffbed0;
                      __x_08._M_len = (size_t)in_stack_ffffffffffffbec8;
                      __y_08._M_str = (char *)in_stack_ffffffffffffbec0;
                      __y_08._M_len = in_stack_ffffffffffffbeb8;
                      bVar1 = std::operator==(__x_08,__y_08);
                      if (bVar1) {
                        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                          (&local_28);
                        if (bVar1) {
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     in_stack_ffffffffffffbeb0,(char *)in_stack_ffffffffffffbea8);
                        }
                        else {
                          local_ce0 = local_28._M_len;
                          local_cd8 = local_28._M_str;
                        }
                        arg._M_str = in_stack_ffffffffffffbf88;
                        arg._M_len = in_stack_ffffffffffffbf80;
                        bVar1 = string_util::lexical_cast<bool>(arg,in_stack_ffffffffffffbf78);
                        if (bVar1) {
                          TrainerSpec::set_shuffle_input_sentence
                                    ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                     SUB41((uint)in_stack_ffffffffffffbe9c >> 0x18,0));
                          util::OkStatus();
                        }
                        else {
                          util::StatusBuilder::StatusBuilder
                                    (in_stack_ffffffffffffbea0,(StatusCode)in_stack_ffffffffffffbe9c
                                     ,in_stack_ffffffffffffbe98);
                          util::StatusBuilder::operator<<
                                    (in_stack_ffffffffffffbea0,
                                     (char (*) [15])
                                     CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                          util::StatusBuilder::operator<<
                                    (in_stack_ffffffffffffbeb0,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     in_stack_ffffffffffffbea8);
                          util::StatusBuilder::operator<<
                                    (in_stack_ffffffffffffbea0,
                                     (char (*) [11])
                                     CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98));
                          util::StatusBuilder::operator_cast_to_Status(in_stack_ffffffffffffbee8);
                          util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cb33b);
                        }
                      }
                      else {
                        local_e70 = local_18;
                        local_e68 = local_10;
                        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_ffffffffffffbeb0,(char *)in_stack_ffffffffffffbea8);
                        __x_09._M_str = (char *)in_stack_ffffffffffffbed0;
                        __x_09._M_len = (size_t)in_stack_ffffffffffffbec8;
                        __y_09._M_str = (char *)in_stack_ffffffffffffbec0;
                        __y_09._M_len = in_stack_ffffffffffffbeb8;
                        bVar1 = std::operator==(__x_09,__y_09);
                        if (bVar1) {
                          local_e98 = local_28._M_len;
                          local_e90 = local_28._M_str;
                          arg_16._M_str = in_stack_ffffffffffffc060;
                          arg_16._M_len = in_stack_ffffffffffffc058;
                          bVar1 = string_util::lexical_cast<int>
                                            (arg_16,(int *)in_stack_ffffffffffffc050);
                          if (bVar1) {
                            TrainerSpec::set_seed_sentencepiece_size
                                      ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                       (int32)in_stack_ffffffffffffbe9c);
                            util::OkStatus();
                          }
                          else {
                            util::StatusBuilder::StatusBuilder
                                      (in_stack_ffffffffffffbea0,
                                       (StatusCode)in_stack_ffffffffffffbe9c,
                                       in_stack_ffffffffffffbe98);
                            util::StatusBuilder::operator<<
                                      (in_stack_ffffffffffffbea0,
                                       (char (*) [15])
                                       CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98)
                                      );
                            util::StatusBuilder::operator<<
                                      (in_stack_ffffffffffffbeb0,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       in_stack_ffffffffffffbea8);
                            util::StatusBuilder::operator<<
                                      (in_stack_ffffffffffffbea0,
                                       (char (*) [10])
                                       CONCAT44(in_stack_ffffffffffffbe9c,in_stack_ffffffffffffbe98)
                                      );
                            util::StatusBuilder::operator_cast_to_Status(in_stack_ffffffffffffbee8);
                            util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cb4d3);
                          }
                        }
                        else {
                          local_1028 = local_18;
                          local_1020 = local_10;
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     in_stack_ffffffffffffbeb0,(char *)in_stack_ffffffffffffbea8);
                          __x_10._M_str = (char *)in_stack_ffffffffffffbed0;
                          __x_10._M_len = (size_t)in_stack_ffffffffffffbec8;
                          __y_10._M_str = (char *)in_stack_ffffffffffffbec0;
                          __y_10._M_len = in_stack_ffffffffffffbeb8;
                          bVar1 = std::operator==(__x_10,__y_10);
                          if (bVar1) {
                            local_1050 = local_28._M_len;
                            local_1048 = local_28._M_str;
                            arg_17._M_str = in_stack_ffffffffffffc060;
                            arg_17._M_len = in_stack_ffffffffffffc058;
                            bVar1 = string_util::lexical_cast<double>
                                              (arg_17,in_stack_ffffffffffffc050);
                            if (bVar1) {
                              TrainerSpec::set_shrinking_factor
                                        ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                         in_stack_ffffffffffffbe9c);
                              util::OkStatus();
                            }
                            else {
                              util::StatusBuilder::StatusBuilder
                                        (in_stack_ffffffffffffbea0,
                                         (StatusCode)in_stack_ffffffffffffbe9c,
                                         in_stack_ffffffffffffbe98);
                              util::StatusBuilder::operator<<
                                        (in_stack_ffffffffffffbea0,
                                         (char (*) [15])
                                         CONCAT44(in_stack_ffffffffffffbe9c,
                                                  in_stack_ffffffffffffbe98));
                              util::StatusBuilder::operator<<
                                        (in_stack_ffffffffffffbeb0,
                                         (basic_string_view<char,_std::char_traits<char>_> *)
                                         in_stack_ffffffffffffbea8);
                              util::StatusBuilder::operator<<
                                        (in_stack_ffffffffffffbea0,
                                         (char (*) [10])
                                         CONCAT44(in_stack_ffffffffffffbe9c,
                                                  in_stack_ffffffffffffbe98));
                              util::StatusBuilder::operator_cast_to_Status
                                        (in_stack_ffffffffffffbee8);
                              util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cb666);
                            }
                          }
                          else {
                            local_11e0 = local_18;
                            local_11d8 = local_10;
                            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       in_stack_ffffffffffffbeb0,(char *)in_stack_ffffffffffffbea8);
                            __x_11._M_str = (char *)in_stack_ffffffffffffbed0;
                            __x_11._M_len = (size_t)in_stack_ffffffffffffbec8;
                            __y_11._M_str = (char *)in_stack_ffffffffffffbec0;
                            __y_11._M_len = in_stack_ffffffffffffbeb8;
                            bVar1 = std::operator==(__x_11,__y_11);
                            if (bVar1) {
                              local_1208 = local_28._M_len;
                              local_1200 = local_28._M_str;
                              arg_18._M_str = in_stack_ffffffffffffc060;
                              arg_18._M_len = in_stack_ffffffffffffc058;
                              bVar1 = string_util::lexical_cast<int>
                                                (arg_18,(int *)in_stack_ffffffffffffc050);
                              if (bVar1) {
                                TrainerSpec::set_max_sentence_length
                                          ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                           (int32)in_stack_ffffffffffffbe9c);
                                util::OkStatus();
                              }
                              else {
                                util::StatusBuilder::StatusBuilder
                                          (in_stack_ffffffffffffbea0,
                                           (StatusCode)in_stack_ffffffffffffbe9c,
                                           in_stack_ffffffffffffbe98);
                                util::StatusBuilder::operator<<
                                          (in_stack_ffffffffffffbea0,
                                           (char (*) [15])
                                           CONCAT44(in_stack_ffffffffffffbe9c,
                                                    in_stack_ffffffffffffbe98));
                                util::StatusBuilder::operator<<
                                          (in_stack_ffffffffffffbeb0,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           in_stack_ffffffffffffbea8);
                                util::StatusBuilder::operator<<
                                          (in_stack_ffffffffffffbea0,
                                           (char (*) [10])
                                           CONCAT44(in_stack_ffffffffffffbe9c,
                                                    in_stack_ffffffffffffbe98));
                                util::StatusBuilder::operator_cast_to_Status
                                          (in_stack_ffffffffffffbee8);
                                util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cb7ff);
                              }
                            }
                            else {
                              local_1398 = local_18;
                              local_1390 = local_10;
                              std::basic_string_view<char,_std::char_traits<char>_>::
                              basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                                in_stack_ffffffffffffbeb0,
                                                (char *)in_stack_ffffffffffffbea8);
                              __x_12._M_str = (char *)in_stack_ffffffffffffbed0;
                              __x_12._M_len = (size_t)in_stack_ffffffffffffbec8;
                              __y_12._M_str = (char *)in_stack_ffffffffffffbec0;
                              __y_12._M_len = in_stack_ffffffffffffbeb8;
                              bVar1 = std::operator==(__x_12,__y_12);
                              if (bVar1) {
                                local_13c0 = local_28._M_len;
                                local_13b8 = local_28._M_str;
                                arg_19._M_str = in_stack_ffffffffffffc060;
                                arg_19._M_len = in_stack_ffffffffffffc058;
                                bVar1 = string_util::lexical_cast<int>
                                                  (arg_19,(int *)in_stack_ffffffffffffc050);
                                if (bVar1) {
                                  TrainerSpec::set_num_threads
                                            ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                             (int32)in_stack_ffffffffffffbe9c);
                                  util::OkStatus();
                                }
                                else {
                                  util::StatusBuilder::StatusBuilder
                                            (in_stack_ffffffffffffbea0,
                                             (StatusCode)in_stack_ffffffffffffbe9c,
                                             in_stack_ffffffffffffbe98);
                                  util::StatusBuilder::operator<<
                                            (in_stack_ffffffffffffbea0,
                                             (char (*) [15])
                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                      in_stack_ffffffffffffbe98));
                                  util::StatusBuilder::operator<<
                                            (in_stack_ffffffffffffbeb0,
                                             (basic_string_view<char,_std::char_traits<char>_> *)
                                             in_stack_ffffffffffffbea8);
                                  util::StatusBuilder::operator<<
                                            (in_stack_ffffffffffffbea0,
                                             (char (*) [10])
                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                      in_stack_ffffffffffffbe98));
                                  util::StatusBuilder::operator_cast_to_Status
                                            (in_stack_ffffffffffffbee8);
                                  util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cb992);
                                }
                              }
                              else {
                                local_1550 = local_18;
                                local_1548 = local_10;
                                std::basic_string_view<char,_std::char_traits<char>_>::
                                basic_string_view((basic_string_view<char,_std::char_traits<char>_>
                                                   *)in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                __x_13._M_str = (char *)in_stack_ffffffffffffbed0;
                                __x_13._M_len = (size_t)in_stack_ffffffffffffbec8;
                                __y_13._M_str = (char *)in_stack_ffffffffffffbec0;
                                __y_13._M_len = in_stack_ffffffffffffbeb8;
                                bVar1 = std::operator==(__x_13,__y_13);
                                if (bVar1) {
                                  local_1578 = local_28._M_len;
                                  local_1570 = local_28._M_str;
                                  arg_20._M_str = in_stack_ffffffffffffc060;
                                  arg_20._M_len = in_stack_ffffffffffffc058;
                                  bVar1 = string_util::lexical_cast<int>
                                                    (arg_20,(int *)in_stack_ffffffffffffc050);
                                  if (bVar1) {
                                    TrainerSpec::set_num_sub_iterations
                                              ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                               (int32)in_stack_ffffffffffffbe9c);
                                    util::OkStatus();
                                  }
                                  else {
                                    util::StatusBuilder::StatusBuilder
                                              (in_stack_ffffffffffffbea0,
                                               (StatusCode)in_stack_ffffffffffffbe9c,
                                               in_stack_ffffffffffffbe98);
                                    util::StatusBuilder::operator<<
                                              (in_stack_ffffffffffffbea0,
                                               (char (*) [15])
                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                        in_stack_ffffffffffffbe98));
                                    util::StatusBuilder::operator<<
                                              (in_stack_ffffffffffffbeb0,
                                               (basic_string_view<char,_std::char_traits<char>_> *)
                                               in_stack_ffffffffffffbea8);
                                    util::StatusBuilder::operator<<
                                              (in_stack_ffffffffffffbea0,
                                               (char (*) [10])
                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                        in_stack_ffffffffffffbe98));
                                    util::StatusBuilder::operator_cast_to_Status
                                              (in_stack_ffffffffffffbee8);
                                    util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cbb25);
                                  }
                                }
                                else {
                                  local_1708 = local_18;
                                  local_1700 = local_10;
                                  std::basic_string_view<char,_std::char_traits<char>_>::
                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                  __x_14._M_str = (char *)in_stack_ffffffffffffbed0;
                                  __x_14._M_len = (size_t)in_stack_ffffffffffffbec8;
                                  __y_14._M_str = (char *)in_stack_ffffffffffffbec0;
                                  __y_14._M_len = in_stack_ffffffffffffbeb8;
                                  bVar1 = std::operator==(__x_14,__y_14);
                                  if (bVar1) {
                                    local_1730 = local_28._M_len;
                                    local_1728 = local_28._M_str;
                                    arg_21._M_str = in_stack_ffffffffffffc060;
                                    arg_21._M_len = in_stack_ffffffffffffc058;
                                    bVar1 = string_util::lexical_cast<int>
                                                      (arg_21,(int *)in_stack_ffffffffffffc050);
                                    if (bVar1) {
                                      TrainerSpec::set_max_sentencepiece_length
                                                ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                                 (int32)in_stack_ffffffffffffbe9c);
                                      util::OkStatus();
                                    }
                                    else {
                                      util::StatusBuilder::StatusBuilder
                                                (in_stack_ffffffffffffbea0,
                                                 (StatusCode)in_stack_ffffffffffffbe9c,
                                                 in_stack_ffffffffffffbe98);
                                      util::StatusBuilder::operator<<
                                                (in_stack_ffffffffffffbea0,
                                                 (char (*) [15])
                                                 CONCAT44(in_stack_ffffffffffffbe9c,
                                                          in_stack_ffffffffffffbe98));
                                      util::StatusBuilder::operator<<
                                                (in_stack_ffffffffffffbeb0,
                                                 (basic_string_view<char,_std::char_traits<char>_> *
                                                 )in_stack_ffffffffffffbea8);
                                      util::StatusBuilder::operator<<
                                                (in_stack_ffffffffffffbea0,
                                                 (char (*) [10])
                                                 CONCAT44(in_stack_ffffffffffffbe9c,
                                                          in_stack_ffffffffffffbe98));
                                      util::StatusBuilder::operator_cast_to_Status
                                                (in_stack_ffffffffffffbee8);
                                      util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4cbcb8)
                                      ;
                                    }
                                  }
                                  else {
                                    local_18c0 = local_18;
                                    local_18b8 = local_10;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                    __x_15._M_str = (char *)in_stack_ffffffffffffbed0;
                                    __x_15._M_len = (size_t)in_stack_ffffffffffffbec8;
                                    __y_15._M_str = (char *)in_stack_ffffffffffffbec0;
                                    __y_15._M_len = in_stack_ffffffffffffbeb8;
                                    bVar1 = std::operator==(__x_15,__y_15);
                                    if (bVar1) {
                                      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>
                                              ::empty(&local_28);
                                      if (bVar1) {
                                        std::basic_string_view<char,_std::char_traits<char>_>::
                                        basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                      }
                                      else {
                                        local_18e8 = local_28._M_len;
                                        local_18e0 = local_28._M_str;
                                      }
                                      arg_00._M_str = in_stack_ffffffffffffbf88;
                                      arg_00._M_len = in_stack_ffffffffffffbf80;
                                      bVar1 = string_util::lexical_cast<bool>
                                                        (arg_00,in_stack_ffffffffffffbf78);
                                      if (bVar1) {
                                        TrainerSpec::set_split_by_unicode_script
                                                  ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                                   SUB41((uint)in_stack_ffffffffffffbe9c >> 0x18,0))
                                        ;
                                        util::OkStatus();
                                      }
                                      else {
                                        util::StatusBuilder::StatusBuilder
                                                  (in_stack_ffffffffffffbea0,
                                                   (StatusCode)in_stack_ffffffffffffbe9c,
                                                   in_stack_ffffffffffffbe98);
                                        util::StatusBuilder::operator<<
                                                  (in_stack_ffffffffffffbea0,
                                                   (char (*) [15])
                                                   CONCAT44(in_stack_ffffffffffffbe9c,
                                                            in_stack_ffffffffffffbe98));
                                        util::StatusBuilder::operator<<
                                                  (in_stack_ffffffffffffbeb0,
                                                   (basic_string_view<char,_std::char_traits<char>_>
                                                    *)in_stack_ffffffffffffbea8);
                                        util::StatusBuilder::operator<<
                                                  (in_stack_ffffffffffffbea0,
                                                   (char (*) [11])
                                                   CONCAT44(in_stack_ffffffffffffbe9c,
                                                            in_stack_ffffffffffffbe98));
                                        util::StatusBuilder::operator_cast_to_Status
                                                  (in_stack_ffffffffffffbee8);
                                        util::StatusBuilder::~StatusBuilder
                                                  ((StatusBuilder *)0x4cbe74);
                                      }
                                    }
                                    else {
                                      local_1a78 = local_18;
                                      local_1a70 = local_10;
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                      __x_16._M_str = (char *)in_stack_ffffffffffffbed0;
                                      __x_16._M_len = (size_t)in_stack_ffffffffffffbec8;
                                      __y_16._M_str = (char *)in_stack_ffffffffffffbec0;
                                      __y_16._M_len = in_stack_ffffffffffffbeb8;
                                      bVar1 = std::operator==(__x_16,__y_16);
                                      if (bVar1) {
                                        bVar1 = std::
                                                basic_string_view<char,_std::char_traits<char>_>::
                                                empty(&local_28);
                                        if (bVar1) {
                                          std::basic_string_view<char,_std::char_traits<char>_>::
                                          basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                        }
                                        else {
                                          local_1aa0 = local_28._M_len;
                                          local_1a98 = local_28._M_str;
                                        }
                                        arg_01._M_str = in_stack_ffffffffffffbf88;
                                        arg_01._M_len = in_stack_ffffffffffffbf80;
                                        bVar1 = string_util::lexical_cast<bool>
                                                          (arg_01,in_stack_ffffffffffffbf78);
                                        if (bVar1) {
                                          TrainerSpec::set_split_by_number
                                                    ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                                     SUB41((uint)in_stack_ffffffffffffbe9c >> 0x18,0
                                                          ));
                                          util::OkStatus();
                                        }
                                        else {
                                          util::StatusBuilder::StatusBuilder
                                                    (in_stack_ffffffffffffbea0,
                                                     (StatusCode)in_stack_ffffffffffffbe9c,
                                                     in_stack_ffffffffffffbe98);
                                          util::StatusBuilder::operator<<
                                                    (in_stack_ffffffffffffbea0,
                                                     (char (*) [15])
                                                     CONCAT44(in_stack_ffffffffffffbe9c,
                                                              in_stack_ffffffffffffbe98));
                                          util::StatusBuilder::operator<<
                                                    (in_stack_ffffffffffffbeb0,
                                                     (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                          util::StatusBuilder::operator<<
                                                    (in_stack_ffffffffffffbea0,
                                                     (char (*) [11])
                                                     CONCAT44(in_stack_ffffffffffffbe9c,
                                                              in_stack_ffffffffffffbe98));
                                          util::StatusBuilder::operator_cast_to_Status
                                                    (in_stack_ffffffffffffbee8);
                                          util::StatusBuilder::~StatusBuilder
                                                    ((StatusBuilder *)0x4cc035);
                                        }
                                      }
                                      else {
                                        local_1c30 = local_18;
                                        local_1c28 = local_10;
                                        std::basic_string_view<char,_std::char_traits<char>_>::
                                        basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                        __x_17._M_str = (char *)in_stack_ffffffffffffbed0;
                                        __x_17._M_len = (size_t)in_stack_ffffffffffffbec8;
                                        __y_17._M_str = (char *)in_stack_ffffffffffffbec0;
                                        __y_17._M_len = in_stack_ffffffffffffbeb8;
                                        bVar1 = std::operator==(__x_17,__y_17);
                                        if (bVar1) {
                                          bVar1 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  empty(&local_28);
                                          if (bVar1) {
                                            std::basic_string_view<char,_std::char_traits<char>_>::
                                            basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                          }
                                          else {
                                            local_1c58 = local_28._M_len;
                                            local_1c50 = local_28._M_str;
                                          }
                                          arg_02._M_str = in_stack_ffffffffffffbf88;
                                          arg_02._M_len = in_stack_ffffffffffffbf80;
                                          bVar1 = string_util::lexical_cast<bool>
                                                            (arg_02,in_stack_ffffffffffffbf78);
                                          if (bVar1) {
                                            TrainerSpec::set_split_by_whitespace
                                                      ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                                       SUB41((uint)in_stack_ffffffffffffbe9c >> 0x18
                                                             ,0));
                                            util::OkStatus();
                                          }
                                          else {
                                            util::StatusBuilder::StatusBuilder
                                                      (in_stack_ffffffffffffbea0,
                                                       (StatusCode)in_stack_ffffffffffffbe9c,
                                                       in_stack_ffffffffffffbe98);
                                            util::StatusBuilder::operator<<
                                                      (in_stack_ffffffffffffbea0,
                                                       (char (*) [15])
                                                       CONCAT44(in_stack_ffffffffffffbe9c,
                                                                in_stack_ffffffffffffbe98));
                                            util::StatusBuilder::operator<<
                                                      (in_stack_ffffffffffffbeb0,
                                                       (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                            util::StatusBuilder::operator<<
                                                      (in_stack_ffffffffffffbea0,
                                                       (char (*) [11])
                                                       CONCAT44(in_stack_ffffffffffffbe9c,
                                                                in_stack_ffffffffffffbe98));
                                            util::StatusBuilder::operator_cast_to_Status
                                                      (in_stack_ffffffffffffbee8);
                                            util::StatusBuilder::~StatusBuilder
                                                      ((StatusBuilder *)0x4cc1f6);
                                          }
                                        }
                                        else {
                                          local_1de8 = local_18;
                                          local_1de0 = local_10;
                                          std::basic_string_view<char,_std::char_traits<char>_>::
                                          basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                          __x_18._M_str = (char *)in_stack_ffffffffffffbed0;
                                          __x_18._M_len = (size_t)in_stack_ffffffffffffbec8;
                                          __y_18._M_str = (char *)in_stack_ffffffffffffbec0;
                                          __y_18._M_len = in_stack_ffffffffffffbeb8;
                                          bVar1 = std::operator==(__x_18,__y_18);
                                          if (bVar1) {
                                            bVar1 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  empty(&local_28);
                                            if (bVar1) {
                                              std::basic_string_view<char,_std::char_traits<char>_>
                                              ::basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                            }
                                            else {
                                              local_1e10 = local_28._M_len;
                                              local_1e08 = local_28._M_str;
                                            }
                                            arg_03._M_str = in_stack_ffffffffffffbf88;
                                            arg_03._M_len = in_stack_ffffffffffffbf80;
                                            bVar1 = string_util::lexical_cast<bool>
                                                              (arg_03,in_stack_ffffffffffffbf78);
                                            if (bVar1) {
                                              TrainerSpec::set_split_digits
                                                        ((TrainerSpec *)in_stack_ffffffffffffbea0,
                                                         SUB41((uint)in_stack_ffffffffffffbe9c >>
                                                               0x18,0));
                                              util::OkStatus();
                                            }
                                            else {
                                              util::StatusBuilder::StatusBuilder
                                                        (in_stack_ffffffffffffbea0,
                                                         (StatusCode)in_stack_ffffffffffffbe9c,
                                                         in_stack_ffffffffffffbe98);
                                              util::StatusBuilder::operator<<
                                                        (in_stack_ffffffffffffbea0,
                                                         (char (*) [15])
                                                         CONCAT44(in_stack_ffffffffffffbe9c,
                                                                  in_stack_ffffffffffffbe98));
                                              util::StatusBuilder::operator<<
                                                        (in_stack_ffffffffffffbeb0,
                                                         (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                              util::StatusBuilder::operator<<
                                                        (in_stack_ffffffffffffbea0,
                                                         (char (*) [11])
                                                         CONCAT44(in_stack_ffffffffffffbe9c,
                                                                  in_stack_ffffffffffffbe98));
                                              util::StatusBuilder::operator_cast_to_Status
                                                        (in_stack_ffffffffffffbee8);
                                              util::StatusBuilder::~StatusBuilder
                                                        ((StatusBuilder *)0x4cc3b7);
                                            }
                                          }
                                          else {
                                            local_1fa0 = local_18;
                                            local_1f98 = local_10;
                                            std::basic_string_view<char,_std::char_traits<char>_>::
                                            basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                            __x_19._M_str = (char *)in_stack_ffffffffffffbed0;
                                            __x_19._M_len = (size_t)in_stack_ffffffffffffbec8;
                                            __y_19._M_str = (char *)in_stack_ffffffffffffbec0;
                                            __y_19._M_len = in_stack_ffffffffffffbeb8;
                                            bVar1 = std::operator==(__x_19,__y_19);
                                            if (bVar1) {
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::
                                              string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                        (in_stack_ffffffffffffbee0,
                                                         in_stack_ffffffffffffbed8,
                                                         (allocator<char> *)
                                                         in_stack_ffffffffffffbed0);
                                              TrainerSpec::set_pretokenization_delimiter
                                                        ((TrainerSpec *)in_stack_ffffffffffffbeb0,
                                                         in_stack_ffffffffffffbea8);
                                              std::__cxx11::string::~string(local_1fd0);
                                              std::allocator<char>::~allocator(&local_1fd1);
                                              util::OkStatus();
                                            }
                                            else {
                                              local_1fe8 = local_18;
                                              local_1fe0 = local_10;
                                              std::basic_string_view<char,_std::char_traits<char>_>
                                              ::basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                              __x_20._M_str = (char *)in_stack_ffffffffffffbed0;
                                              __x_20._M_len = (size_t)in_stack_ffffffffffffbec8;
                                              __y_20._M_str = (char *)in_stack_ffffffffffffbec0;
                                              __y_20._M_len = in_stack_ffffffffffffbeb8;
                                              bVar1 = std::operator==(__x_20,__y_20);
                                              if (bVar1) {
                                                bVar1 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  empty(&local_28);
                                                if (bVar1) {
                                                  std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                }
                                                else {
                                                  local_2010 = local_28._M_len;
                                                  local_2008 = local_28._M_str;
                                                }
                                                arg_04._M_str = in_stack_ffffffffffffbf88;
                                                arg_04._M_len = in_stack_ffffffffffffbf80;
                                                bVar1 = string_util::lexical_cast<bool>
                                                                  (arg_04,in_stack_ffffffffffffbf78)
                                                ;
                                                if (bVar1) {
                                                  TrainerSpec::set_treat_whitespace_as_suffix
                                                            ((TrainerSpec *)
                                                             in_stack_ffffffffffffbea0,
                                                             SUB41((uint)in_stack_ffffffffffffbe9c
                                                                   >> 0x18,0));
                                                  util::OkStatus();
                                                }
                                                else {
                                                  util::StatusBuilder::StatusBuilder
                                                            (in_stack_ffffffffffffbea0,
                                                             (StatusCode)in_stack_ffffffffffffbe9c,
                                                             in_stack_ffffffffffffbe98);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [15])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbeb0,
                                                             (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [11])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cc6aa);
                                                }
                                              }
                                              else {
                                                local_21a0 = local_18;
                                                local_2198 = local_10;
                                                std::
                                                basic_string_view<char,_std::char_traits<char>_>::
                                                basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                __x_21._M_str = (char *)in_stack_ffffffffffffbed0;
                                                __x_21._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                __y_21._M_str = (char *)in_stack_ffffffffffffbec0;
                                                __y_21._M_len = in_stack_ffffffffffffbeb8;
                                                bVar1 = std::operator==(__x_21,__y_21);
                                                if (bVar1) {
                                                  bVar1 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  empty(&local_28);
                                                  if (bVar1) {
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  }
                                                  else {
                                                    local_21c8 = local_28._M_len;
                                                    local_21c0 = local_28._M_str;
                                                  }
                                                  arg_05._M_str = in_stack_ffffffffffffbf88;
                                                  arg_05._M_len = in_stack_ffffffffffffbf80;
                                                  bVar1 = string_util::lexical_cast<bool>
                                                                    (arg_05,
                                                  in_stack_ffffffffffffbf78);
                                                  if (bVar1) {
                                                    TrainerSpec::set_allow_whitespace_only_pieces
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               SUB41((uint)in_stack_ffffffffffffbe9c
                                                                     >> 0x18,0));
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [11])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cc86b);
                                                  }
                                                }
                                                else {
                                                  local_2358 = local_18;
                                                  local_2350 = local_10;
                                                  std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_22._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_22._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_22._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_22._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_22,__y_22);
                                                  if (bVar1) {
                                                    local_2398 = local_28._M_len;
                                                    local_2390 = local_28._M_str;
                                                    text_01._M_str = in_stack_ffffffffffffbf68;
                                                    text_01._M_len = in_stack_ffffffffffffbf60;
                                                    util::StrSplitAsCSV_abi_cxx11_(text_01);
                                                    local_2370 = local_2388;
                                                    local_23a0._M_current =
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT44(in_stack_ffffffffffffbe9c,
                                                             in_stack_ffffffffffffbe98));
                                                  local_23a8 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT44(in_stack_ffffffffffffbe9c,
                                                             in_stack_ffffffffffffbe98));
                                                  while( true ) {
                                                    bVar1 = __gnu_cxx::operator!=
                                                                      ((
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffbea0,
                                                  (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)CONCAT44(in_stack_ffffffffffffbe9c,
                                                             in_stack_ffffffffffffbe98));
                                                  if (!bVar1) break;
                                                  local_23b0 = __gnu_cxx::
                                                                                                                              
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator*(&local_23a0);
                                                  TrainerSpec::add_control_symbols
                                                            ((TrainerSpec *)
                                                             in_stack_ffffffffffffbea0,
                                                             (string *)
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  __gnu_cxx::
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator++(&local_23a0);
                                                  }
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_ffffffffffffbeb0);
                                                  util::OkStatus();
                                                  }
                                                  else {
                                                    local_23c0 = local_18;
                                                    local_23b8 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_23._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_23._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_23._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_23._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_23,__y_23);
                                                  if (bVar1) {
                                                    local_2400 = local_28._M_len;
                                                    local_23f8 = local_28._M_str;
                                                    text_02._M_str = in_stack_ffffffffffffbf68;
                                                    text_02._M_len = in_stack_ffffffffffffbf60;
                                                    util::StrSplitAsCSV_abi_cxx11_(text_02);
                                                    local_23d8 = local_23f0;
                                                    local_2408._M_current =
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT44(in_stack_ffffffffffffbe9c,
                                                             in_stack_ffffffffffffbe98));
                                                  local_2410 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)CONCAT44(in_stack_ffffffffffffbe9c,
                                                             in_stack_ffffffffffffbe98));
                                                  while( true ) {
                                                    bVar1 = __gnu_cxx::operator!=
                                                                      ((
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffbea0,
                                                  (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)CONCAT44(in_stack_ffffffffffffbe9c,
                                                             in_stack_ffffffffffffbe98));
                                                  if (!bVar1) break;
                                                  local_2418 = __gnu_cxx::
                                                                                                                              
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator*(&local_2408);
                                                  TrainerSpec::add_user_defined_symbols
                                                            ((TrainerSpec *)
                                                             in_stack_ffffffffffffbea0,
                                                             (string *)
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  __gnu_cxx::
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator++(&local_2408);
                                                  }
                                                  std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_ffffffffffffbeb0);
                                                  util::OkStatus();
                                                  }
                                                  else {
                                                    local_2428 = local_18;
                                                    local_2420 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_24._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_24._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_24._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_24._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_24,__y_24);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                                                                        
                                                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                            (in_stack_ffffffffffffbee0,
                                                             in_stack_ffffffffffffbed8,
                                                             (allocator<char> *)
                                                             in_stack_ffffffffffffbed0);
                                                  TrainerSpec::set_required_chars
                                                            ((TrainerSpec *)
                                                             in_stack_ffffffffffffbeb0,
                                                             in_stack_ffffffffffffbea8);
                                                  std::__cxx11::string::~string(local_2458);
                                                  std::allocator<char>::~allocator(&local_2459);
                                                  util::OkStatus();
                                                  }
                                                  else {
                                                    local_2470 = local_18;
                                                    local_2468 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_25._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_25._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_25._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_25._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_25,__y_25);
                                                  if (bVar1) {
                                                    bVar1 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  empty(&local_28);
                                                  if (bVar1) {
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  }
                                                  else {
                                                    local_2498 = local_28._M_len;
                                                    local_2490 = local_28._M_str;
                                                  }
                                                  arg_06._M_str = in_stack_ffffffffffffbf88;
                                                  arg_06._M_len = in_stack_ffffffffffffbf80;
                                                  bVar1 = string_util::lexical_cast<bool>
                                                                    (arg_06,
                                                  in_stack_ffffffffffffbf78);
                                                  if (bVar1) {
                                                    TrainerSpec::set_byte_fallback
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               SUB41((uint)in_stack_ffffffffffffbe9c
                                                                     >> 0x18,0));
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [11])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cce4a);
                                                  }
                                                  }
                                                  else {
                                                    local_2628 = local_18;
                                                    local_2620 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_26._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_26._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_26._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_26._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_26,__y_26);
                                                  if (bVar1) {
                                                    bVar1 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  empty(&local_28);
                                                  if (bVar1) {
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  }
                                                  else {
                                                    local_2650 = local_28._M_len;
                                                    local_2648 = local_28._M_str;
                                                  }
                                                  arg_07._M_str = in_stack_ffffffffffffbf88;
                                                  arg_07._M_len = in_stack_ffffffffffffbf80;
                                                  bVar1 = string_util::lexical_cast<bool>
                                                                    (arg_07,
                                                  in_stack_ffffffffffffbf78);
                                                  if (bVar1) {
                                                    TrainerSpec::set_hard_vocab_limit
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               SUB41((uint)in_stack_ffffffffffffbe9c
                                                                     >> 0x18,0));
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [11])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cd00b);
                                                  }
                                                  }
                                                  else {
                                                    local_27e0 = local_18;
                                                    local_27d8 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_27._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_27._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_27._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_27._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_27,__y_27);
                                                  if (bVar1) {
                                                    bVar1 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  empty(&local_28);
                                                  if (bVar1) {
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  }
                                                  else {
                                                    local_2808 = local_28._M_len;
                                                    local_2800 = local_28._M_str;
                                                  }
                                                  arg_08._M_str = in_stack_ffffffffffffbf88;
                                                  arg_08._M_len = in_stack_ffffffffffffbf80;
                                                  bVar1 = string_util::lexical_cast<bool>
                                                                    (arg_08,
                                                  in_stack_ffffffffffffbf78);
                                                  if (bVar1) {
                                                    TrainerSpec::set_vocabulary_output_piece_score
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               SUB41((uint)in_stack_ffffffffffffbe9c
                                                                     >> 0x18,0));
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [11])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cd1cc);
                                                  }
                                                  }
                                                  else {
                                                    local_2998 = local_18;
                                                    local_2990 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_28._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_28._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_28._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_28._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_28,__y_28);
                                                  if (bVar1) {
                                                    bVar1 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  empty(&local_28);
                                                  if (bVar1) {
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  }
                                                  else {
                                                    local_29c0 = local_28._M_len;
                                                    local_29b8 = local_28._M_str;
                                                  }
                                                  arg_09._M_str = in_stack_ffffffffffffbf88;
                                                  arg_09._M_len = in_stack_ffffffffffffbf80;
                                                  bVar1 = string_util::lexical_cast<bool>
                                                                    (arg_09,
                                                  in_stack_ffffffffffffbf78);
                                                  if (bVar1) {
                                                    TrainerSpec::set_train_extremely_large_corpus
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               SUB41((uint)in_stack_ffffffffffffbe9c
                                                                     >> 0x18,0));
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [11])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cd38d);
                                                  }
                                                  }
                                                  else {
                                                    local_2b50 = local_18;
                                                    local_2b48 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_29._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_29._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_29._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_29._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_29,__y_29);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                                                                        
                                                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                            (in_stack_ffffffffffffbee0,
                                                             in_stack_ffffffffffffbed8,
                                                             (allocator<char> *)
                                                             in_stack_ffffffffffffbed0);
                                                  TrainerSpec::set_seed_sentencepieces_file
                                                            ((TrainerSpec *)
                                                             in_stack_ffffffffffffbeb0,
                                                             in_stack_ffffffffffffbea8);
                                                  std::__cxx11::string::~string(local_2b80);
                                                  std::allocator<char>::~allocator(&local_2b81);
                                                  util::OkStatus();
                                                  }
                                                  else {
                                                    local_2b98 = local_18;
                                                    local_2b90 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_30._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_30._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_30._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_30._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_30,__y_30);
                                                  if (bVar1) {
                                                    bVar1 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  empty(&local_28);
                                                  if (bVar1) {
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  }
                                                  else {
                                                    local_2bc0 = local_28._M_len;
                                                    local_2bb8 = local_28._M_str;
                                                  }
                                                  arg_10._M_str = in_stack_ffffffffffffbf88;
                                                  arg_10._M_len = in_stack_ffffffffffffbf80;
                                                  bVar1 = string_util::lexical_cast<bool>
                                                                    (arg_10,
                                                  in_stack_ffffffffffffbf78);
                                                  if (bVar1) {
                                                    TrainerSpec::set_use_all_vocab
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               SUB41((uint)in_stack_ffffffffffffbe9c
                                                                     >> 0x18,0));
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [11])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cd680);
                                                  }
                                                  }
                                                  else {
                                                    local_2d50 = local_18;
                                                    local_2d48 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_31._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_31._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_31._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_31._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_31,__y_31);
                                                  if (bVar1) {
                                                    local_2d78 = local_28._M_len;
                                                    local_2d70 = local_28._M_str;
                                                    arg_22._M_str = in_stack_ffffffffffffc060;
                                                    arg_22._M_len = in_stack_ffffffffffffc058;
                                                    bVar1 = string_util::lexical_cast<int>
                                                                      (arg_22,(int *)
                                                  in_stack_ffffffffffffc050);
                                                  if (bVar1) {
                                                    TrainerSpec::set_unk_id
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               (int32)in_stack_ffffffffffffbe9c);
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [10])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cd818);
                                                  }
                                                  }
                                                  else {
                                                    local_2f08 = local_18;
                                                    local_2f00 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_32._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_32._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_32._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_32._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_32,__y_32);
                                                  if (bVar1) {
                                                    local_2f30 = local_28._M_len;
                                                    local_2f28 = local_28._M_str;
                                                    arg_23._M_str = in_stack_ffffffffffffc060;
                                                    arg_23._M_len = in_stack_ffffffffffffc058;
                                                    bVar1 = string_util::lexical_cast<int>
                                                                      (arg_23,(int *)
                                                  in_stack_ffffffffffffc050);
                                                  if (bVar1) {
                                                    TrainerSpec::set_bos_id
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               (int32)in_stack_ffffffffffffbe9c);
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [10])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cd9ab);
                                                  }
                                                  }
                                                  else {
                                                    local_30c0 = local_18;
                                                    local_30b8 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_33._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_33._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_33._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_33._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_33,__y_33);
                                                  if (bVar1) {
                                                    local_30e8 = local_28._M_len;
                                                    local_30e0 = local_28._M_str;
                                                    arg_24._M_str = in_stack_ffffffffffffc060;
                                                    arg_24._M_len = in_stack_ffffffffffffc058;
                                                    bVar1 = string_util::lexical_cast<int>
                                                                      (arg_24,(int *)
                                                  in_stack_ffffffffffffc050);
                                                  if (bVar1) {
                                                    TrainerSpec::set_eos_id
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               (int32)in_stack_ffffffffffffbe9c);
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [10])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cdb3e);
                                                  }
                                                  }
                                                  else {
                                                    local_3278 = local_18;
                                                    local_3270 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_34._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_34._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_34._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_34._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_34,__y_34);
                                                  if (bVar1) {
                                                    local_32a0 = local_28._M_len;
                                                    local_3298 = local_28._M_str;
                                                    arg_25._M_str = in_stack_ffffffffffffc060;
                                                    arg_25._M_len = in_stack_ffffffffffffc058;
                                                    bVar1 = string_util::lexical_cast<int>
                                                                      (arg_25,(int *)
                                                  in_stack_ffffffffffffc050);
                                                  if (bVar1) {
                                                    TrainerSpec::set_pad_id
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               (int32)in_stack_ffffffffffffbe9c);
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [10])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4cdcd1);
                                                  }
                                                  }
                                                  else {
                                                    local_3430 = local_18;
                                                    local_3428 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_35._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_35._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_35._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_35._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_35,__y_35);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                                                                        
                                                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                            (in_stack_ffffffffffffbee0,
                                                             in_stack_ffffffffffffbed8,
                                                             (allocator<char> *)
                                                             in_stack_ffffffffffffbed0);
                                                  TrainerSpec::set_unk_piece
                                                            ((TrainerSpec *)
                                                             in_stack_ffffffffffffbeb0,
                                                             in_stack_ffffffffffffbea8);
                                                  std::__cxx11::string::~string(local_3460);
                                                  std::allocator<char>::~allocator(&local_3461);
                                                  util::OkStatus();
                                                  }
                                                  else {
                                                    local_3478 = local_18;
                                                    local_3470 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_36._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_36._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_36._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_36._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_36,__y_36);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                                                                        
                                                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                            (in_stack_ffffffffffffbee0,
                                                             in_stack_ffffffffffffbed8,
                                                             (allocator<char> *)
                                                             in_stack_ffffffffffffbed0);
                                                  TrainerSpec::set_bos_piece
                                                            ((TrainerSpec *)
                                                             in_stack_ffffffffffffbeb0,
                                                             in_stack_ffffffffffffbea8);
                                                  std::__cxx11::string::~string(local_34a8);
                                                  std::allocator<char>::~allocator(&local_34a9);
                                                  util::OkStatus();
                                                  }
                                                  else {
                                                    local_34c0 = local_18;
                                                    local_34b8 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_37._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_37._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_37._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_37._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_37,__y_37);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                                                                        
                                                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                            (in_stack_ffffffffffffbee0,
                                                             in_stack_ffffffffffffbed8,
                                                             (allocator<char> *)
                                                             in_stack_ffffffffffffbed0);
                                                  TrainerSpec::set_eos_piece
                                                            ((TrainerSpec *)
                                                             in_stack_ffffffffffffbeb0,
                                                             in_stack_ffffffffffffbea8);
                                                  std::__cxx11::string::~string(local_34f0);
                                                  std::allocator<char>::~allocator(&local_34f1);
                                                  util::OkStatus();
                                                  }
                                                  else {
                                                    local_3508 = local_18;
                                                    local_3500 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_38._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_38._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_38._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_38._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_38,__y_38);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                                                                        
                                                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                            (in_stack_ffffffffffffbee0,
                                                             in_stack_ffffffffffffbed8,
                                                             (allocator<char> *)
                                                             in_stack_ffffffffffffbed0);
                                                  TrainerSpec::set_pad_piece
                                                            ((TrainerSpec *)
                                                             in_stack_ffffffffffffbeb0,
                                                             in_stack_ffffffffffffbea8);
                                                  std::__cxx11::string::~string(local_3538);
                                                  std::allocator<char>::~allocator(&local_3539);
                                                  util::OkStatus();
                                                  }
                                                  else {
                                                    local_3550 = local_18;
                                                    local_3548 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_39._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_39._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_39._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_39._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_39,__y_39);
                                                  if (bVar1) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                                                                        
                                                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                                                            (in_stack_ffffffffffffbee0,
                                                             in_stack_ffffffffffffbed8,
                                                             (allocator<char> *)
                                                             in_stack_ffffffffffffbed0);
                                                  TrainerSpec::set_unk_surface
                                                            ((TrainerSpec *)
                                                             in_stack_ffffffffffffbeb0,
                                                             in_stack_ffffffffffffbea8);
                                                  std::__cxx11::string::~string(local_3580);
                                                  std::allocator<char>::~allocator(&local_3581);
                                                  util::OkStatus();
                                                  }
                                                  else {
                                                    local_3598 = local_18;
                                                    local_3590 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_40._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_40._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_40._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_40._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_40,__y_40);
                                                  if (bVar1) {
                                                    bVar1 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  empty(&local_28);
                                                  if (bVar1) {
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  }
                                                  else {
                                                    local_35c0 = local_28._M_len;
                                                    local_35b8 = local_28._M_str;
                                                  }
                                                  arg_11._M_str = in_stack_ffffffffffffbf88;
                                                  arg_11._M_len = in_stack_ffffffffffffbf80;
                                                  bVar1 = string_util::lexical_cast<bool>
                                                                    (arg_11,
                                                  in_stack_ffffffffffffbf78);
                                                  if (bVar1) {
                                                    TrainerSpec::set_enable_differential_privacy
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               SUB41((uint)in_stack_ffffffffffffbe9c
                                                                     >> 0x18,0));
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [11])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4ce475);
                                                  }
                                                  }
                                                  else {
                                                    local_3750 = local_18;
                                                    local_3748 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_41._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_41._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_41._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_41._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_41,__y_41);
                                                  if (bVar1) {
                                                    local_3778 = local_28._M_len;
                                                    local_3770 = local_28._M_str;
                                                    arg_26._M_str = in_stack_ffffffffffffc060;
                                                    arg_26._M_len = in_stack_ffffffffffffc058;
                                                    bVar1 = string_util::lexical_cast<double>
                                                                      (arg_26,
                                                  in_stack_ffffffffffffc050);
                                                  if (bVar1) {
                                                    TrainerSpec::
                                                    set_differential_privacy_noise_level
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               in_stack_ffffffffffffbe9c);
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    pSVar3 = util::StatusBuilder::operator<<
                                                                       (in_stack_ffffffffffffbeb0,
                                                                        (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [10])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (pSVar3);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4ce5f5);
                                                  }
                                                  }
                                                  else {
                                                    local_3908 = local_18;
                                                    local_3900 = local_10;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view((
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbeb0,
                                                  (char *)in_stack_ffffffffffffbea8);
                                                  __x_42._M_str = (char *)in_stack_ffffffffffffbed0;
                                                  __x_42._M_len = (size_t)in_stack_ffffffffffffbec8;
                                                  __y_42._M_str = (char *)in_stack_ffffffffffffbec0;
                                                  __y_42._M_len = in_stack_ffffffffffffbeb8;
                                                  bVar1 = std::operator==(__x_42,__y_42);
                                                  if (bVar1) {
                                                    local_3930 = local_28._M_len;
                                                    local_3928 = local_28._M_str;
                                                    arg_27._M_str = in_stack_ffffffffffffc060;
                                                    arg_27._M_len = in_stack_ffffffffffffc058;
                                                    bVar1 = string_util::lexical_cast<unsigned_long>
                                                                      (arg_27,(unsigned_long *)
                                                                                                                                                            
                                                  in_stack_ffffffffffffc050);
                                                  if (bVar1) {
                                                    TrainerSpec::
                                                    set_differential_privacy_clipping_threshold
                                                              ((TrainerSpec *)
                                                               in_stack_ffffffffffffbea0,
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::OkStatus();
                                                  }
                                                  else {
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [15])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbeb0,
                                                               (
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [10])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4ce776);
                                                  }
                                                  }
                                                  else {
                                                    pSVar3 = local_3c30;
                                                    util::StatusBuilder::StatusBuilder
                                                              (in_stack_ffffffffffffbea0,
                                                               (StatusCode)in_stack_ffffffffffffbe9c
                                                               ,in_stack_ffffffffffffbe98);
                                                    util::StatusBuilder::operator<<
                                                              (in_stack_ffffffffffffbea0,
                                                               (char (*) [21])
                                                               CONCAT44(in_stack_ffffffffffffbe9c,
                                                                        in_stack_ffffffffffffbe98));
                                                    util::StatusBuilder::operator<<
                                                              (pSVar3,(
                                                  basic_string_view<char,_std::char_traits<char>_> *
                                                  )in_stack_ffffffffffffbea8);
                                                  util::StatusBuilder::operator<<
                                                            (in_stack_ffffffffffffbea0,
                                                             (char (*) [18])
                                                             CONCAT44(in_stack_ffffffffffffbe9c,
                                                                      in_stack_ffffffffffffbe98));
                                                  util::StatusBuilder::operator_cast_to_Status
                                                            (in_stack_ffffffffffffbee8);
                                                  util::StatusBuilder::~StatusBuilder
                                                            ((StatusBuilder *)0x4ce84b);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceTrainer::SetProtoField(absl::string_view name,
                                                 absl::string_view value,
                                                 TrainerSpec *message) {
  CHECK_OR_RETURN(message);

  PARSE_REPEATED_STRING(input);
  PARSE_STRING(input_format);
  PARSE_STRING(model_prefix);

  static const std::map<std::string, TrainerSpec::ModelType> kModelType_Map = {
      {"UNIGRAM", TrainerSpec::UNIGRAM},
      {"BPE", TrainerSpec::BPE},
      {"WORD", TrainerSpec::WORD},
      {"CHAR", TrainerSpec::CHAR},
  };

  PARSE_ENUM(model_type, kModelType_Map);
  PARSE_INT32(vocab_size);
  PARSE_REPEATED_STRING(accept_language);
  PARSE_INT32(self_test_sample_size);
  PARSE_DOUBLE(character_coverage);
  PARSE_UINT64(input_sentence_size);
  PARSE_BOOL(shuffle_input_sentence);
  PARSE_INT32(seed_sentencepiece_size);
  PARSE_DOUBLE(shrinking_factor);
  PARSE_INT32(max_sentence_length);
  PARSE_INT32(num_threads);
  PARSE_INT32(num_sub_iterations);
  PARSE_INT32(max_sentencepiece_length);
  PARSE_BOOL(split_by_unicode_script);
  PARSE_BOOL(split_by_number);
  PARSE_BOOL(split_by_whitespace);
  PARSE_BOOL(split_digits);
  PARSE_STRING(pretokenization_delimiter);
  PARSE_BOOL(treat_whitespace_as_suffix);
  PARSE_BOOL(allow_whitespace_only_pieces);
  PARSE_REPEATED_STRING(control_symbols);
  PARSE_REPEATED_STRING(user_defined_symbols);
  PARSE_STRING(required_chars);
  PARSE_BOOL(byte_fallback);
  PARSE_BOOL(hard_vocab_limit);
  PARSE_BOOL(vocabulary_output_piece_score);
  PARSE_BOOL(train_extremely_large_corpus);
  PARSE_STRING(seed_sentencepieces_file);
  PARSE_BOOL(use_all_vocab);
  PARSE_INT32(unk_id);
  PARSE_INT32(bos_id);
  PARSE_INT32(eos_id);
  PARSE_INT32(pad_id);
  PARSE_STRING(unk_piece);
  PARSE_STRING(bos_piece);
  PARSE_STRING(eos_piece);
  PARSE_STRING(pad_piece);
  PARSE_STRING(unk_surface);
  PARSE_BOOL(enable_differential_privacy);
  PARSE_DOUBLE(differential_privacy_noise_level);
  PARSE_UINT64(differential_privacy_clipping_threshold);

  return util::StatusBuilder(util::StatusCode::kNotFound, GTL_LOC)
         << "unknown field name \"" << name << "\" in TrainerSpec.";
}